

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O2

DAngle __thiscall DBot::FireRox(DBot *this,AActor *enemy,ticcmd_t *cmd)

{
  _func_int **pp_Var1;
  bool bVar2;
  AActor *this_00;
  AActor *pAVar3;
  ticcmd_t *in_RCX;
  FCheckPosition *this_01;
  double dVar4;
  double extraout_XMM0_Qa;
  DAngle DVar5;
  double extraout_XMM0_Qa_00;
  FCheckPosition tm;
  
  pp_Var1 = (enemy->snext->super_DThinker).super_DObject._vptr_DObject;
  tm.pos.Y = (double)pp_Var1[0x30] * 0.5 + (double)pp_Var1[0xb];
  tm.thing = (AActor *)((double)pp_Var1[0x19] * 5.0 + (double)pp_Var1[9]);
  tm.pos.X = (double)pp_Var1[0x1a] * 5.0 + (double)pp_Var1[10];
  FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&tm,2);
  this_00 = GC::ReadBarrier<AActor>((AActor **)&bglobal.body2);
  dVar4 = AActor::Distance2D(this_00,(AActor *)cmd,false);
  if (140.0 <= dVar4) {
    pAVar3 = GetDefaultByName("Rocket");
    dVar4 = (dVar4 + 1.0) / pAVar3->Speed + 2.0;
    tm.thing = (AActor *)(dVar4 * *(double *)&cmd[10].ucmd + *(double *)&cmd[3].ucmd.sidemove);
    tm.pos.X = dVar4 * *(double *)&cmd[10].ucmd.roll + *(double *)&cmd[4].ucmd;
    tm.pos.Y = -2147483648.0;
    FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&tm,1);
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&bglobal.body1);
    bVar2 = P_CheckSight(this_00,pAVar3,1);
    if (bVar2) {
      this_01 = &tm;
      FCheckPosition::FCheckPosition(&tm,false);
      bVar2 = FCajunMaster::SafeCheckPosition
                        ((FCajunMaster *)this_01,
                         (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                         (this_00->__Pos).X,(this_00->__Pos).Y,&tm);
      if (bVar2) {
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)&bglobal.body1);
        dVar4 = FCajunMaster::FakeFire(&bglobal,this_00,pAVar3,in_RCX);
        if (140.0 <= dVar4) {
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)&bglobal.body1);
          AActor::AngleTo((AActor *)this,this_00,SUB81(pAVar3,0));
          TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&tm.LastRipped);
          return (DAngle)extraout_XMM0_Qa_00;
        }
      }
      TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&tm.LastRipped);
    }
    bVar2 = P_CheckSight(this_00,(AActor *)cmd,0);
    dVar4 = extraout_XMM0_Qa;
    if ((bVar2) &&
       (dVar4 = FCajunMaster::FakeFire
                          (&bglobal,(AActor *)
                                    (enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                           (AActor *)cmd,in_RCX), 140.0 <= dVar4)) {
      DVar5 = AActor::AngleTo((AActor *)this,
                              (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                              SUB81(cmd,0));
      return (DAngle)DVar5.Degrees;
    }
  }
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)0x0;
  return (DAngle)dVar4;
}

Assistant:

DAngle DBot::FireRox (AActor *enemy, ticcmd_t *cmd)
{
	double dist;
	AActor *actor;
	double m;

	bglobal.SetBodyAt(player->mo->PosPlusZ(player->mo->Height / 2) + player->mo->Vel.XY() * 5, 2);

	actor = bglobal.body2;

	dist = actor->Distance2D (enemy);
	if (dist < SAFE_SELF_MISDIST)
		return 0.;
	//Predict.
	m = ((dist+1) / GetDefaultByName("Rocket")->Speed);

	bglobal.SetBodyAt(DVector3((enemy->Pos() + enemy->Vel * (m + 2)), ONFLOORZ), 1);
	
	//try the predicted location
	if (P_CheckSight (actor, bglobal.body1, SF_IGNOREVISIBILITY)) //See the predicted location, so give a test missile
	{
		FCheckPosition tm;
		if (bglobal.SafeCheckPosition (player->mo, actor->X(), actor->Y(), tm))
		{
			if (bglobal.FakeFire (actor, bglobal.body1, cmd) >= SAFE_SELF_MISDIST)
			{
				return actor->AngleTo(bglobal.body1);
			}
		}
	}
	//Try fire straight.
	if (P_CheckSight (actor, enemy, 0))
	{
		if (bglobal.FakeFire (player->mo, enemy, cmd) >= SAFE_SELF_MISDIST)
		{
			return player->mo->AngleTo(enemy);
		}
	}
	return 0.;
}